

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SpectrumPtexTexture::Evaluate
          (SpectrumPtexTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  array<float,_4> aVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [56];
  undefined1 auVar4 [64];
  SampledSpectrum SVar6;
  float *in_stack_00000020;
  PtexTextureBase *in_stack_00000028;
  TextureEvalContext in_stack_00000040;
  int nc;
  float result [3];
  undefined1 auVar8 [16];
  undefined1 auVar7 [52];
  RGB local_90 [3];
  undefined1 local_68 [64];
  int local_28;
  Float local_24;
  Float local_20;
  Float local_1c;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar5 [56];
  undefined1 auVar9 [24];
  
  memcpy(local_68,&stack0x00000008,0x40);
  auVar2 = vmovdqu64_avx512f(local_68);
  auVar2 = vmovdqu64_avx512f(auVar2);
  auVar7 = auVar2._32_52_;
  local_28 = PtexTextureBase::SampleTexture(in_stack_00000028,in_stack_00000040,in_stack_00000020);
  auVar9 = auVar7._28_24_;
  if (local_28 == 1) {
    SampledSpectrum::SampledSpectrum(auVar7._4_8_,auVar7._0_4_);
  }
  else {
    auVar3 = (undefined1  [56])0x0;
    auVar5 = (undefined1  [56])0x0;
    RGB::RGB(local_90,local_24,local_20,local_1c);
    auVar8 = auVar9._8_16_;
    RGBReflectanceSpectrum::RGBReflectanceSpectrum(auVar9._16_8_,auVar9._8_8_,auVar9._0_8_);
    SVar6 = RGBReflectanceSpectrum::Sample(auVar8._8_8_,auVar8._0_8_);
    auVar4._0_8_ = SVar6.values.values._8_8_;
    auVar4._8_56_ = auVar5;
    auVar2._0_8_ = SVar6.values.values._0_8_;
    auVar2._8_56_ = auVar3;
    local_10 = vmovlpd_avx(auVar2._0_16_);
    local_8 = vmovlpd_avx(auVar4._0_16_);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

SampledSpectrum SpectrumPtexTexture::Evaluate(TextureEvalContext ctx,
                                              SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return SampledSpectrum(0);
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return SampledSpectrum(result[0]);
    DCHECK_EQ(3, nc);
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB,
                                  RGB(result[0], result[1], result[2]))
        .Sample(lambda);
#endif
}